

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonCodec.cc
# Opt level: O2

size_t __thiscall
avro::parsing::JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_>::
decodeUnionIndex(JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *this)

{
  JsonParser *this_00;
  SimpleParser<avro::parsing::JsonDecoderHandler> *this_01;
  Token TVar1;
  size_t n;
  allocator<char> local_39;
  string local_38;
  
  this_01 = &this->parser_;
  SimpleParser<avro::parsing::JsonDecoderHandler>::advance(this_01,sUnion);
  this_00 = &this->in_;
  TVar1 = json::JsonParser::peek(this_00);
  if (TVar1 == tkNull) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"null",&local_39);
    n = SimpleParser<avro::parsing::JsonDecoderHandler>::indexForName(this_01,&local_38);
  }
  else {
    json::JsonParser::expectToken(this_00,tkObjectStart);
    json::JsonParser::expectToken(this_00,tkString);
    std::__cxx11::string::string((string *)&local_38,(string *)&(this->in_).sv);
    n = SimpleParser<avro::parsing::JsonDecoderHandler>::indexForName(this_01,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  SimpleParser<avro::parsing::JsonDecoderHandler>::selectBranch(this_01,n);
  return n;
}

Assistant:

size_t JsonDecoder<P>::decodeUnionIndex()
{
    parser_.advance(Symbol::sUnion);

    size_t result;
    if (in_.peek() == JsonParser::tkNull) {
        result = parser_.indexForName("null");
    } else {
        expect(JsonParser::tkObjectStart);
        expect(JsonParser::tkString);
        result = parser_.indexForName(in_.stringValue());
    }
    parser_.selectBranch(result);
    return result;
}